

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

QTextEdit * __thiscall QTextEdit::cursorForPosition(QTextEdit *this,QPoint *pos)

{
  long lVar1;
  QPointF *pos_00;
  QPoint *in_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos_00 = *(QPointF **)((long)pos[1] + 0x2f8);
  QTextEditPrivate::mapToContents((QTextEditPrivate *)pos[1],in_RDX);
  QWidgetTextControl::cursorForPosition((QWidgetTextControl *)this,pos_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextCursor QTextEdit::cursorForPosition(const QPoint &pos) const
{
    Q_D(const QTextEdit);
    return d->control->cursorForPosition(d->mapToContents(pos));
}